

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::Nested> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    **pointer = 1;
    if (*(long *)((long)pointer + 0x10) != 0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))();
    }
    operator_delete(pointer,0x18);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }